

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint ucvector_resize(ucvector *p,size_t size)

{
  uint uVar1;
  undefined8 in_RSI;
  long in_RDI;
  undefined4 local_4;
  
  uVar1 = ucvector_reserve(p,size);
  if (uVar1 != 0) {
    *(undefined8 *)(in_RDI + 8) = in_RSI;
  }
  local_4 = (uint)(uVar1 != 0);
  return local_4;
}

Assistant:

static unsigned ucvector_resize(ucvector* p, size_t size) {
  if(!ucvector_reserve(p, size * sizeof(unsigned char))) return 0;
  p->size = size;
  return 1; /*success*/
}